

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_type_traits.hpp
# Opt level: O0

basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>
jsoncons::
json_type_traits<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_bigint<std::allocator<unsigned_char>_>,_void>
::to_json(basic_bigint<std::allocator<unsigned_char>_> *val)

{
  undefined8 extraout_RDX;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *in_RSI;
  undefined8 in_RDI;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_000000a8;
  basic_bigint<std::allocator<unsigned_char>_> *in_stack_000000b0;
  string local_30 [23];
  semantic_tag in_stack_ffffffffffffffe7;
  string_type *in_stack_ffffffffffffffe8;
  
  std::__cxx11::string::string(local_30);
  basic_bigint<std::allocator<unsigned_char>>::
  write_string<char,std::char_traits<char>,std::allocator<char>>
            (in_stack_000000b0,in_stack_000000a8);
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::basic_json
            (in_RSI,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe7);
  std::__cxx11::string::~string(local_30);
  bVar1.field_0.int64_.val_ = extraout_RDX;
  bVar1.field_0._0_8_ = in_RDI;
  return (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>)bVar1.field_0;
}

Assistant:

static Json to_json(const basic_bigint<Allocator>& val)
        {
            std::basic_string<char_type> s;
            val.write_string(s);
            return Json(s,semantic_tag::bigint);
        }